

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall
QList<QDockAreaLayoutItem>::move(QList<QDockAreaLayoutItem> *this,qsizetype from,qsizetype to)

{
  long lVar1;
  Data *pDVar2;
  QDockAreaLayoutItem *pQVar3;
  long lVar4;
  QDockAreaLayoutItem *pQVar5;
  
  if (from == to) {
    return;
  }
  pDVar2 = (this->d).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<QDockAreaLayoutItem>::reallocateAndGrow
              (&this->d,GrowsAtEnd,0,(QArrayDataPointer<QDockAreaLayoutItem> *)0x0);
  }
  pQVar3 = (this->d).ptr;
  if (from < to) {
    lVar1 = from * 0x28;
    pQVar5 = pQVar3 + from + 1;
    lVar4 = to * 5;
  }
  else {
    lVar1 = to * 0x28;
    lVar4 = from * 5;
    pQVar5 = pQVar3 + from;
  }
  std::_V2::__rotate<QDockAreaLayoutItem*>
            ((long)&pQVar3->widgetItem + lVar1,pQVar5,&pQVar3[1].widgetItem + lVar4);
  return;
}

Assistant:

void move(qsizetype from, qsizetype to)
    {
        Q_ASSERT_X(from >= 0 && from < size(), "QList::move(qsizetype, qsizetype)", "'from' is out-of-range");
        Q_ASSERT_X(to >= 0 && to < size(), "QList::move(qsizetype, qsizetype)", "'to' is out-of-range");
        if (from == to) // don't detach when no-op
            return;
        detach();
        T * const b = d->begin();
        if (from < to)
            std::rotate(b + from, b + from + 1, b + to + 1);
        else
            std::rotate(b + to, b + from, b + from + 1);
    }